

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_13792d8::ObmcVarianceTest_DISABLED_Speed_Test::TestBody
          (ObmcVarianceTest_DISABLED_Speed_Test *this)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long in_RDI;
  int elapsed_time_simd;
  int i_2;
  int elapsed_time_c;
  int i_1;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  uint tst_sse;
  uint ref_sse;
  int num_loops;
  int i;
  int pre_stride;
  int32_t mask [16384];
  int32_t wsrc [16384];
  uint8_t pre [16384];
  int in_stack_fffffffffffdbf44;
  undefined4 in_stack_fffffffffffdbf48;
  uint in_stack_fffffffffffdbf4c;
  int iStack_240a4;
  int iStack_2409c;
  aom_usec_timer aStack_24098;
  aom_usec_timer aStack_24078;
  undefined1 auStack_24054 [4];
  undefined1 auStack_24050 [4];
  undefined4 uStack_2404c;
  int iStack_24048;
  int iStack_24044;
  int aiStack_24040 [16384];
  int aiStack_14040 [16384];
  uint8_t local_4040 [16440];
  
  iStack_24044 = libaom_test::ACMRandom::operator()
                           ((ACMRandom *)
                            CONCAT44(in_stack_fffffffffffdbf4c,in_stack_fffffffffffdbf48),
                            in_stack_fffffffffffdbf44);
  for (iStack_24048 = 0; iStack_24048 < 0x4000; iStack_24048 = iStack_24048 + 1) {
    uVar1 = libaom_test::ACMRandom::Rand8
                      ((ACMRandom *)CONCAT44(in_stack_fffffffffffdbf4c,in_stack_fffffffffffdbf48));
    local_4040[iStack_24048] = uVar1;
    bVar2 = libaom_test::ACMRandom::Rand8
                      ((ACMRandom *)CONCAT44(in_stack_fffffffffffdbf4c,in_stack_fffffffffffdbf48));
    in_stack_fffffffffffdbf4c = (uint)bVar2;
    iVar3 = libaom_test::ACMRandom::operator()
                      ((ACMRandom *)(ulong)CONCAT14(bVar2,in_stack_fffffffffffdbf48),
                       in_stack_fffffffffffdbf44);
    aiStack_14040[iStack_24048] = in_stack_fffffffffffdbf4c * iVar3;
    iVar3 = libaom_test::ACMRandom::operator()
                      ((ACMRandom *)CONCAT44(in_stack_fffffffffffdbf4c,in_stack_fffffffffffdbf48),
                       in_stack_fffffffffffdbf44);
    aiStack_24040[iStack_24048] = iVar3;
  }
  uStack_2404c = 1000000;
  ::aom_usec_timer_start((aom_usec_timer *)0xbdde46);
  for (iStack_2409c = 0; iStack_2409c < 1000000; iStack_2409c = iStack_2409c + 1) {
    (**(code **)(in_RDI + 0x20))(local_4040,iStack_24044,aiStack_14040,aiStack_24040,auStack_24050);
  }
  ::aom_usec_timer_mark((aom_usec_timer *)0xbdde9b);
  uVar4 = ::aom_usec_timer_elapsed(&aStack_24078);
  ::aom_usec_timer_start((aom_usec_timer *)0xbddeb3);
  for (iStack_240a4 = 0; iStack_240a4 < 1000000; iStack_240a4 = iStack_240a4 + 1) {
    (**(code **)(in_RDI + 0x28))(local_4040,iStack_24044,aiStack_14040,aiStack_24040,auStack_24054);
  }
  ::aom_usec_timer_mark((aom_usec_timer *)0xbddf08);
  uVar5 = ::aom_usec_timer_elapsed(&aStack_24098);
  printf("c_time=%d \t simd_time=%d \t gain=%f \n",(double)(int)uVar4 / (double)(int)uVar5,
         uVar4 & 0xffffffff,uVar5 & 0xffffffff);
  return;
}

Assistant:

TEST_P(ObmcVarianceTest, DISABLED_Speed) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  const int pre_stride = this->rng_(MAX_SB_SIZE + 1);

  for (int i = 0; i < MAX_SB_SQUARE; ++i) {
    pre[i] = this->rng_.Rand8();
    wsrc[i] = this->rng_.Rand8() * this->rng_(kMaskMax * kMaskMax + 1);
    mask[i] = this->rng_(kMaskMax * kMaskMax + 1);
  }

  const int num_loops = 1000000;
  unsigned int ref_sse, tst_sse;
  aom_usec_timer ref_timer, test_timer;

  aom_usec_timer_start(&ref_timer);
  for (int i = 0; i < num_loops; ++i) {
    params_.ref_func(pre, pre_stride, wsrc, mask, &ref_sse);
  }
  aom_usec_timer_mark(&ref_timer);
  const int elapsed_time_c =
      static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

  aom_usec_timer_start(&test_timer);
  for (int i = 0; i < num_loops; ++i) {
    params_.tst_func(pre, pre_stride, wsrc, mask, &tst_sse);
  }
  aom_usec_timer_mark(&test_timer);
  const int elapsed_time_simd =
      static_cast<int>(aom_usec_timer_elapsed(&test_timer));

  printf("c_time=%d \t simd_time=%d \t gain=%f \n", elapsed_time_c,
         elapsed_time_simd,
         static_cast<double>(elapsed_time_c) / elapsed_time_simd);
}